

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.h
# Opt level: O3

set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_> * __thiscall
covenant::CFG::computeGenerating
          (set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_>
           *__return_storage_ptr__,CFG *this)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  int iVar4;
  size_type sVar5;
  _Base_ptr p_Var6;
  pointer pvVar7;
  ulong uVar8;
  pointer pPVar9;
  _Base_ptr p_Var10;
  uint uVar11;
  ulong uVar12;
  bool bVar13;
  int iVar14;
  _Rb_tree_header *p_Var15;
  bool bVar16;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> RHS;
  Sym local_5c;
  _Rb_tree_header *local_58;
  vector<covenant::Sym,_std::allocator<covenant::Sym>_> local_50;
  long local_38;
  
  p_Var15 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  uVar12 = 0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var15->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var15->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  pvVar7 = (this->prods).
           super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  bVar13 = false;
  do {
    uVar8 = ((long)(this->prods).
                   super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar7 >> 3) *
            -0x5555555555555555;
    while (uVar8 < uVar12 || uVar8 - uVar12 == 0) {
      uVar12 = 0;
      bVar16 = !bVar13;
      bVar13 = false;
      if (bVar16) {
        return __return_storage_ptr__;
      }
    }
    local_38 = uVar12 * 3;
    pPVar9 = pvVar7[uVar12].
             super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>.
             _M_impl.super__Vector_impl_data._M_start;
    iVar2 = (int)uVar12;
    if (*(pointer *)
         ((long)&pvVar7[uVar12].
                 super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                 ._M_impl.super__Vector_impl_data + 8) != pPVar9) {
      iVar14 = iVar2 * 2;
      iVar4 = iVar2 * 2 + 1;
      uVar12 = 0;
      local_58 = p_Var15;
      do {
        std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>::vector
                  (&local_50,
                   (this->rules).
                   super__Vector_base<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>,_std::allocator<std::vector<covenant::Sym,_std::allocator<covenant::Sym>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start + pPVar9[uVar12].rule);
        if (local_50.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
            super__Vector_impl_data._M_finish ==
            local_50.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
            super__Vector_impl_data._M_start) {
LAB_0014e0a6:
          p_Var6 = (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
          p_Var10 = &p_Var15->_M_header;
          local_5c.x = iVar4;
          if (p_Var6 == (_Base_ptr)0x0) {
LAB_0014e0e3:
            std::
            _Rb_tree<covenant::Sym,covenant::Sym,std::_Identity<covenant::Sym>,std::less<covenant::Sym>,std::allocator<covenant::Sym>>
            ::_M_insert_unique<covenant::Sym_const&>
                      ((_Rb_tree<covenant::Sym,covenant::Sym,std::_Identity<covenant::Sym>,std::less<covenant::Sym>,std::allocator<covenant::Sym>>
                        *)__return_storage_ptr__,&local_5c);
            bVar3 = 1;
          }
          else {
            do {
              iVar1 = (int)*(size_t *)(p_Var6 + 1);
              bVar16 = iVar1 + iVar2 * -2 < 0;
              if (iVar1 != iVar14 && SBORROW4(iVar1,iVar14) == bVar16) {
                p_Var10 = p_Var6;
              }
              p_Var6 = (&p_Var6->_M_left)[iVar1 == iVar14 || SBORROW4(iVar1,iVar14) != bVar16];
            } while (p_Var6 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var10 == p_Var15) ||
               (iVar4 < (int)((_Rb_tree_header *)p_Var10)->_M_node_count)) goto LAB_0014e0e3;
            bVar3 = 0;
          }
          bVar13 = (bool)(bVar13 | bVar3);
        }
        else {
          uVar8 = 0;
          uVar11 = 0;
          do {
            while (uVar11 = uVar11 + 1,
                  (local_50.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                   _M_impl.super__Vector_impl_data._M_start[uVar8].x & 1) == 0) {
              uVar8 = (ulong)uVar11;
              p_Var15 = local_58;
              if ((ulong)((long)local_50.
                                super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                _M_impl.super__Vector_impl_data._M_finish -
                          (long)local_50.
                                super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>.
                                _M_impl.super__Vector_impl_data._M_start >> 2) <= uVar8)
              goto LAB_0014e0a6;
            }
            sVar5 = std::
                    set<covenant::Sym,_std::less<covenant::Sym>,_std::allocator<covenant::Sym>_>::
                    count(__return_storage_ptr__,
                          local_50.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                          ._M_impl.super__Vector_impl_data._M_start + uVar8);
            uVar8 = (ulong)uVar11;
          } while ((uVar8 < (ulong)((long)local_50.
                                          super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                          ._M_impl.super__Vector_impl_data._M_finish -
                                    (long)local_50.
                                          super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                                          ._M_impl.super__Vector_impl_data._M_start >> 2)) &&
                  (sVar5 != 0));
          p_Var15 = local_58;
          if (sVar5 != 0) goto LAB_0014e0a6;
        }
        if (local_50.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_50.super__Vector_base<covenant::Sym,_std::allocator<covenant::Sym>_>
                          ._M_impl.super__Vector_impl_data._M_start);
        }
        uVar12 = (ulong)((int)uVar12 + 1);
        pvVar7 = (this->prods).
                 super__Vector_base<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>,_std::allocator<std::vector<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pPVar9 = *(pointer *)
                  ((long)&(pvVar7->
                          super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                          )._M_impl.super__Vector_impl_data + local_38 * 8);
      } while (uVar12 < (ulong)(*(long *)((long)&(pvVar7->
                                                 super__Vector_base<covenant::CFG::ProdInfo,_std::allocator<covenant::CFG::ProdInfo>_>
                                                 )._M_impl.super__Vector_impl_data +
                                         local_38 * 8 + 8) - (long)pPVar9 >> 2));
    }
    uVar12 = (ulong)(iVar2 + 1);
  } while( true );
}

Assistant:

set<Sym> computeGenerating()
    {
      set<Sym> GenSet;
      bool change=true;
      while (change)
      {
        change = false;
        for ( unsigned int vv = 0; vv < prods.size(); vv++ )
        {
          for ( unsigned int ri = 0; ri < prods[vv].size(); ri++ )
          {
            const int r = prods[vv][ri].rule;
            vector<Sym> RHS = rules[r];
            bool allSatisfy=true;
            for(unsigned si =0; (si < RHS.size() && allSatisfy) ; si++)
            {
              if (!(RHS[si].isTerm() || GenSet.count(RHS[si]) > 0))
                allSatisfy=false;
            }
            if (allSatisfy)
              change |= InsertAndNotifyChange(GenSet,Sym::mkVar(vv));
          }
        }
      }
      return GenSet;
    }